

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O1

void pbrt::PrintStackTrace(void)

{
  char cVar1;
  uint uVar2;
  void *__ptr;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  int validCppName;
  char offset [64];
  void *callstack [32];
  char functionSymbol [1024];
  char moduleName [1024];
  int local_984;
  ulong local_980;
  char local_978 [64];
  undefined8 local_938 [32];
  char local_838 [1024];
  char local_438 [1032];
  
  uVar2 = backtrace(local_938,0x20);
  __ptr = (void *)backtrace_symbols(local_938);
  if (0 < (int)uVar2) {
    uVar7 = 0;
    local_980 = (ulong)uVar2;
    do {
      memset(local_438,0,0x400);
      memset(local_838,0,0x400);
      local_978[0] = '\0';
      local_978[1] = '\0';
      local_978[2] = '\0';
      local_978[3] = '\0';
      local_978[4] = '\0';
      local_978[5] = '\0';
      local_978[6] = '\0';
      local_978[7] = '\0';
      local_978[8] = '\0';
      local_978[9] = '\0';
      local_978[10] = '\0';
      local_978[0xb] = '\0';
      local_978[0xc] = '\0';
      local_978[0xd] = '\0';
      local_978[0xe] = '\0';
      local_978[0xf] = '\0';
      local_978[0x10] = '\0';
      local_978[0x11] = '\0';
      local_978[0x12] = '\0';
      local_978[0x13] = '\0';
      local_978[0x14] = '\0';
      local_978[0x15] = '\0';
      local_978[0x16] = '\0';
      local_978[0x17] = '\0';
      local_978[0x18] = '\0';
      local_978[0x19] = '\0';
      local_978[0x1a] = '\0';
      local_978[0x1b] = '\0';
      local_978[0x1c] = '\0';
      local_978[0x1d] = '\0';
      local_978[0x1e] = '\0';
      local_978[0x1f] = '\0';
      local_978[0x20] = '\0';
      local_978[0x21] = '\0';
      local_978[0x22] = '\0';
      local_978[0x23] = '\0';
      local_978[0x24] = '\0';
      local_978[0x25] = '\0';
      local_978[0x26] = '\0';
      local_978[0x27] = '\0';
      local_978[0x28] = '\0';
      local_978[0x29] = '\0';
      local_978[0x2a] = '\0';
      local_978[0x2b] = '\0';
      local_978[0x2c] = '\0';
      local_978[0x2d] = '\0';
      local_978[0x2e] = '\0';
      local_978[0x2f] = '\0';
      local_978[0x30] = '\0';
      local_978[0x31] = '\0';
      local_978[0x32] = '\0';
      local_978[0x33] = '\0';
      local_978[0x34] = '\0';
      local_978[0x35] = '\0';
      local_978[0x36] = '\0';
      local_978[0x37] = '\0';
      local_978[0x38] = '\0';
      local_978[0x39] = '\0';
      local_978[0x3a] = '\0';
      local_978[0x3b] = '\0';
      local_978[0x3c] = '\0';
      local_978[0x3d] = '\0';
      local_978[0x3e] = '\0';
      local_978[0x3f] = '\0';
      local_984 = 0;
      pcVar3 = local_438;
      pcVar6 = *(char **)((long)__ptr + uVar7 * 8);
      while( true ) {
        pcVar5 = pcVar6 + 1;
        cVar1 = *pcVar6;
        if ((cVar1 == '\0') || (cVar1 == '(')) break;
        *pcVar3 = cVar1;
        pcVar3 = pcVar3 + 1;
        pcVar6 = pcVar5;
      }
      *pcVar3 = '\0';
      pcVar3 = local_838;
      if (*pcVar5 == '+') {
        builtin_strncpy(local_838,"(unknown)",10);
        pcVar5 = pcVar6 + 2;
LAB_00256718:
        for (lVar4 = 0; (cVar1 = pcVar5[lVar4], cVar1 != '\0' && (cVar1 != ')')); lVar4 = lVar4 + 1)
        {
          local_978[lVar4] = cVar1;
        }
        local_978[lVar4] = '\0';
        local_984 = 0;
        pcVar3 = (char *)__cxa_demangle(local_838,0,0,&local_984);
        pcVar6 = local_838;
        if (local_984 == 0) {
          pcVar6 = pcVar3;
        }
        fprintf(_stderr,"(%-40s)\t0x%p - %s + %s\n",local_438,local_938[uVar7],pcVar6,local_978);
      }
      else {
        for (; (cVar1 = *pcVar5, cVar1 != '\0' && (cVar1 != '+')); pcVar5 = pcVar5 + 1) {
          *pcVar3 = cVar1;
          pcVar3 = pcVar3 + 1;
        }
        *pcVar3 = '\0';
        if (cVar1 == '+') {
          pcVar5 = pcVar5 + 1;
          goto LAB_00256718;
        }
        PrintStackTrace((pbrt *)((long)__ptr + uVar7 * 8));
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_980);
  }
  free(__ptr);
  return;
}

Assistant:

void PrintStackTrace() {
#if defined(PBRT_IS_OSX)
    void* callstack[32];
    int frames = backtrace(callstack, PBRT_ARRAYSIZE(callstack));
    char** strs = backtrace_symbols(callstack, frames);
    for (int i = 0; i < frames; ++i) {
        // https://www.variadic.xyz/2013/04/14/generating-stack-trace-on-os-x/
        char functionSymbol[1024] = {};
        char moduleName[1024] = {};
        int offset = 0;
        char addr[48] = {};

        // split the string, take out chunks out of stack trace
        // we are primarily interested in module, function and address
        sscanf(strs[i], "%*s %s %s %s %*s %d", moduleName, addr, functionSymbol, &offset);

        if (strcmp(moduleName, "pbrt") != 0)
            // We've past the pbrt stack frames
            break;

        int validCppName = 0;
        char* functionName = abi::__cxa_demangle(functionSymbol, NULL, 0, &validCppName);

        char stackFrame[4096] = {};
        if (validCppName == 0)
            fprintf(stderr, "(%s)\t0x%s - %s + %d\n", moduleName, addr, functionName,
                    offset);
        else
            fprintf(stderr, "(%s)\t0x%s - %s + %d\n", moduleName, addr, functionSymbol,
                    offset);
    }
    free(strs);
#elif defined(PBRT_IS_LINUX)
    void *callstack[32];
    int frames = backtrace(callstack, PBRT_ARRAYSIZE(callstack));
    char **strs = backtrace_symbols(callstack, frames);
    for (int i = 0; i < frames; ++i) {
        char moduleName[1024] = {};
        char functionSymbol[1024] = {};
        char offset[64] = {};
        int validCppName = 0;
        char *demangledFunctionSymbol = nullptr;

        const char *ptr = strs[i];
        char *mptr = moduleName;
        while (*ptr && *ptr != '(')
            *mptr++ = *ptr++;
        *mptr = '\0';
        ++ptr;
        if (*ptr == '+') {
            strcpy(functionSymbol, "(unknown)");
            ++ptr;
        } else {
            // Copy mangled function name
            char *fptr = functionSymbol;
            while (*ptr && *ptr != '+')
                *fptr++ = *ptr++;
            *fptr = '\0';

            if (*ptr != '+') {
                fprintf(stderr, "Unable to decode frame: %s\n", strs[i]);
                continue;
            }
            ++ptr;
        }

        char *optr = offset;
        while (*ptr && *ptr != ')')
            *optr++ = *ptr++;
        *optr = '\0';

        validCppName = 0;
        demangledFunctionSymbol =
            abi::__cxa_demangle(functionSymbol, NULL, 0, &validCppName);

        if (validCppName == 0)
            fprintf(stderr, "(%-40s)\t0x%p - %s + %s\n", moduleName, callstack[i],
                    demangledFunctionSymbol, offset);
        else
            fprintf(stderr, "(%-40s)\t0x%p - %s + %s\n", moduleName, callstack[i],
                    functionSymbol, offset);
    }
    free(strs);
#elif defined(PBRT_IS_WINDOWS)
    // Via
    // https://stackoverflow.com/questions/22467604/how-can-you-use-capturestackbacktrace-to-capture-the-exception-stack-not-the-ca
    void *stack[32];
    constexpr int maxNameLength = 1024;
    HANDLE process = GetCurrentProcess();
    SymInitialize(process, NULL, TRUE);
    WORD nFrames = CaptureStackBackTrace(0, PBRT_ARRAYSIZE(stack), stack, NULL);
    SYMBOL_INFO *symbol =
        (SYMBOL_INFO *)malloc(sizeof(SYMBOL_INFO) + (maxNameLength - 1) * sizeof(TCHAR));
    symbol->MaxNameLen = maxNameLength;
    symbol->SizeOfStruct = sizeof(SYMBOL_INFO);
    DWORD displacement;
    IMAGEHLP_LINE64 *line = (IMAGEHLP_LINE64 *)malloc(sizeof(IMAGEHLP_LINE64));
    line->SizeOfStruct = sizeof(IMAGEHLP_LINE64);
    for (int i = 0; i < nFrames; ++i) {
        DWORD64 address = (DWORD64)(stack[i]);
        SymFromAddr(process, address, NULL, symbol);
        if (SymGetLineFromAddr64(process, address, &displacement, line))
            fprintf(stderr, "(%-40s)\t0x%p - %s + line %d\n", line->FileName,
                    (void *)symbol->Address, symbol->Name, line->LineNumber);
        else
            fprintf(stderr, "(%-40s)\t0x%p - %s\n", "unknown", (void *)symbol->Address,
                    symbol->Name);
    }
#else
#error "TODO: implement PrintStackTrace for target"
#endif
}